

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitdeque.h
# Opt level: O1

size_type __thiscall bitdeque<32768>::size(bitdeque<32768> *this)

{
  _Map_pointer ppbVar1;
  long in_FS_OFFSET;
  
  ppbVar1 = (this->m_deque).
            super__Deque_base<std::bitset<32768UL>,_std::allocator<std::bitset<32768UL>_>_>._M_impl.
            super__Deque_impl_data._M_finish._M_node;
  if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
    return ((((ulong)((long)ppbVar1 -
                     (long)(this->m_deque).
                           super__Deque_base<std::bitset<32768UL>,_std::allocator<std::bitset<32768UL>_>_>
                           ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
            (ulong)(ppbVar1 == (_Map_pointer)0x0) +
           ((ulong)((long)(this->m_deque).
                          super__Deque_base<std::bitset<32768UL>,_std::allocator<std::bitset<32768UL>_>_>
                          ._M_impl.super__Deque_impl_data._M_start._M_last -
                   (long)(this->m_deque).
                         super__Deque_base<std::bitset<32768UL>,_std::allocator<std::bitset<32768UL>_>_>
                         ._M_impl.super__Deque_impl_data._M_start._M_cur) >> 0xc) +
           ((ulong)((long)(this->m_deque).
                          super__Deque_base<std::bitset<32768UL>,_std::allocator<std::bitset<32768UL>_>_>
                          ._M_impl.super__Deque_impl_data._M_finish._M_cur -
                   (long)(this->m_deque).
                         super__Deque_base<std::bitset<32768UL>,_std::allocator<std::bitset<32768UL>_>_>
                         ._M_impl.super__Deque_impl_data._M_finish._M_first) >> 0xc)) * 0x8000 -
           ((long)this->m_pad_end + (long)this->m_pad_begin);
  }
  __stack_chk_fail();
}

Assistant:

size_type size() const noexcept { return m_deque.size() * BITS_PER_WORD - m_pad_begin - m_pad_end; }